

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

ImGuiTableSettings * ImGui::TableSettingsFindByID(ImGuiID id)

{
  int iVar1;
  char *pcVar2;
  ImGuiTableSettings *pIVar3;
  ImGuiTableSettings *pIVar4;
  
  pcVar2 = (GImGui->SettingsTables).Buf.Data;
  if (pcVar2 != (char *)0x0) {
    pIVar4 = (ImGuiTableSettings *)(pcVar2 + 4);
    pIVar3 = pIVar4;
    do {
      if (pIVar3->ID == id) {
        return pIVar3;
      }
      iVar1._0_1_ = pIVar3[-1].ColumnsCount;
      iVar1._1_1_ = pIVar3[-1].ColumnsCountMax;
      iVar1._2_1_ = pIVar3[-1].WantApply;
      iVar1._3_1_ = pIVar3[-1].field_0xf;
      pIVar3 = (ImGuiTableSettings *)((long)&pIVar3->ID + (long)iVar1);
    } while (pIVar3 != (ImGuiTableSettings *)
                       ((long)&pIVar4->ID + (long)(GImGui->SettingsTables).Buf.Size));
  }
  return (ImGuiTableSettings *)0x0;
}

Assistant:

ImGuiTableSettings* ImGui::TableSettingsFindByID(ImGuiID id)
{
    // FIXME-OPT: Might want to store a lookup map for this?
    ImGuiContext& g = *GImGui;
    for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
        if (settings->ID == id)
            return settings;
    return NULL;
}